

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

void embree::fix_bspline_end_points
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *indices,
               avector<Vec3ff> *positions)

{
  ulong uVar1;
  size_type sVar2;
  const_reference pvVar3;
  long in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  vfloat4 v3;
  vfloat4 v2;
  vfloat4 v1;
  vfloat4 v0;
  size_t idx;
  size_t i;
  vfloat4 b_1;
  vfloat4 b;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  ulong local_8b8;
  ulong uStack_8b0;
  ulong local_8a8;
  ulong uStack_8a0;
  ulong local_898;
  ulong uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  ulong local_878;
  ulong uStack_870;
  ulong local_868;
  ulong uStack_860;
  ulong local_858;
  ulong uStack_850;
  ulong local_848;
  ulong uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  ulong local_818;
  ulong uStack_810;
  ulong local_808;
  ulong local_800;
  long local_7f8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_7f0;
  long local_7e8;
  ulong local_7d8;
  long local_7c8;
  long local_7c0;
  long local_7b8;
  long local_7b0;
  long local_7a8;
  long local_7a0;
  ulong local_798;
  long local_790;
  ulong *local_788;
  ulong *local_780;
  undefined8 *local_778;
  undefined8 *local_770;
  undefined8 *local_768;
  undefined8 *local_760;
  ulong *local_758;
  ulong *local_750;
  ulong *local_748;
  ulong *local_740;
  ulong *local_738;
  ulong *local_730;
  ulong *local_728;
  ulong *local_720;
  ulong *local_718;
  ulong *local_710;
  ulong local_708;
  ulong uStack_700;
  ulong *local_6f8;
  ulong *local_6f0;
  ulong local_6e8;
  ulong uStack_6e0;
  ulong *local_6d8;
  ulong *local_6d0;
  undefined8 *local_6c8;
  undefined8 *local_6c0;
  ulong *local_6b8;
  undefined8 *local_6b0;
  undefined8 *local_6a8;
  ulong *local_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 *local_680;
  undefined4 local_674;
  undefined8 *local_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 *local_650;
  undefined4 local_644;
  undefined8 *local_640;
  ulong *local_638;
  ulong *local_630;
  ulong *local_628;
  ulong *local_620;
  ulong *local_618;
  ulong *local_610;
  ulong *local_608;
  ulong *local_600;
  ulong *local_5f8;
  undefined8 *local_5f0;
  undefined8 *local_5e8;
  ulong *local_5e0;
  float local_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  ulong *local_5c0;
  float local_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  ulong *local_5a0;
  ulong local_598;
  ulong uStack_590;
  ulong *local_580;
  ulong local_578;
  ulong uStack_570;
  ulong *local_560;
  ulong local_558;
  ulong uStack_550;
  ulong *local_540;
  ulong local_538;
  ulong uStack_530;
  ulong *local_520;
  ulong local_518;
  ulong uStack_510;
  ulong *local_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 *local_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 *local_4c0;
  ulong local_4b8;
  ulong uStack_4b0;
  ulong *local_4a0;
  ulong local_498;
  ulong uStack_490;
  ulong local_488;
  ulong uStack_480;
  uint local_478;
  uint uStack_474;
  uint uStack_470;
  uint uStack_46c;
  ulong local_468;
  ulong uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  ulong local_448;
  ulong uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  ulong local_428;
  ulong uStack_420;
  ulong local_418;
  ulong uStack_410;
  ulong local_408;
  ulong uStack_400;
  ulong local_3f8;
  ulong uStack_3f0;
  ulong local_3e8;
  ulong uStack_3e0;
  ulong *local_3d8;
  ulong *local_3d0;
  ulong *local_3c8;
  ulong *local_3c0;
  ulong *local_3b8;
  ulong *local_3b0;
  undefined8 *local_3a8;
  undefined8 *local_3a0;
  undefined8 *local_398;
  undefined8 *local_390;
  ulong *local_388;
  ulong *local_380;
  ulong *local_378;
  ulong *local_370;
  ulong *local_368;
  ulong *local_360;
  ulong *local_358;
  ulong *local_350;
  ulong local_348;
  ulong uStack_340;
  ulong local_338;
  ulong uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  ulong local_318;
  ulong uStack_310;
  int local_308;
  int iStack_304;
  int iStack_300;
  int iStack_2fc;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  uint local_2e8;
  uint uStack_2e4;
  uint uStack_2e0;
  uint uStack_2dc;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined4 local_2c8;
  undefined4 local_2c4;
  undefined4 local_2c0;
  undefined4 local_2bc;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  ulong local_278;
  ulong uStack_270;
  ulong local_268;
  ulong uStack_260;
  ulong local_258;
  ulong uStack_250;
  ulong *local_240;
  ulong local_238;
  ulong uStack_230;
  ulong *local_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined4 local_208;
  undefined4 local_204;
  undefined4 local_200;
  undefined4 local_1fc;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined4 local_1e8;
  undefined4 local_1e4;
  undefined4 local_1e0;
  undefined4 local_1dc;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined4 local_1c8;
  undefined4 local_1c4;
  undefined4 local_1c0;
  undefined4 local_1bc;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined4 local_1a8;
  undefined4 local_1a4;
  undefined4 local_1a0;
  undefined4 local_19c;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 *local_150;
  undefined8 *local_148;
  undefined8 *local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  undefined8 *local_108;
  undefined8 *local_100;
  undefined8 *local_f8;
  undefined8 *local_f0;
  undefined8 *local_e8;
  undefined8 *local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined8 *local_a0;
  undefined8 *local_98;
  undefined8 *local_90;
  undefined4 local_84;
  undefined8 *local_80;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 local_64;
  undefined8 *local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_3c;
  ulong local_38;
  ulong uStack_30;
  ulong *local_20;
  ulong local_18;
  ulong uStack_10;
  ulong *local_8;
  
  local_800 = 0;
  local_7f8 = in_RSI;
  local_7f0 = in_RDI;
  while( true ) {
    uVar1 = local_800;
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_7f0);
    if (sVar2 <= uVar1) break;
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (local_7f0,local_800);
    local_808 = (ulong)*pvVar3;
    local_790 = local_7f8;
    local_758 = (ulong *)(*(long *)(local_7f8 + 0x18) + local_808 * 0x10);
    local_750 = &local_818;
    local_518 = *local_758;
    uStack_510 = local_758[1];
    local_7a8 = local_808 + 1;
    local_7a0 = local_7f8;
    local_768 = (undefined8 *)(*(long *)(local_7f8 + 0x18) + local_7a8 * 0x10);
    local_760 = &local_828;
    local_4f8 = *local_768;
    uStack_4f0 = local_768[1];
    local_7b8 = local_808 + 2;
    local_7b0 = local_7f8;
    local_778 = (undefined8 *)(*(long *)(local_7f8 + 0x18) + local_7b8 * 0x10);
    local_770 = &local_838;
    local_4d8 = *local_778;
    uStack_4d0 = local_778[1];
    local_7c8 = local_808 + 3;
    local_7c0 = local_7f8;
    local_788 = (ulong *)(*(long *)(local_7f8 + 0x18) + local_7c8 * 0x10);
    local_780 = &local_848;
    local_4b8 = *local_788;
    uStack_4b0 = local_788[1];
    local_718 = &local_868;
    local_2c4 = 0x7fffffff;
    local_1bc = 0x7fffffff;
    local_1c0 = 0x7fffffff;
    local_1c4 = 0x7fffffff;
    local_1c8 = 0x7fffffff;
    local_458 = 0x7fffffff7fffffff;
    uStack_450 = 0x7fffffff7fffffff;
    local_598 = local_518 & 0x7fffffff7fffffff;
    uStack_590 = uStack_510 & 0x7fffffff7fffffff;
    local_580 = &local_6e8;
    local_2c8 = 0x7f800000;
    local_19c = 0x7f800000;
    local_1a0 = 0x7f800000;
    local_1a4 = 0x7f800000;
    local_1a8 = 0x7f800000;
    local_2b8 = 0x7f8000007f800000;
    uStack_2b0 = 0x7f8000007f800000;
    local_2a8._0_4_ = (uint)local_598;
    local_2a8._4_4_ = (uint)(local_598 >> 0x20);
    uStack_2a0._0_4_ = (uint)uStack_590;
    uStack_2a0._4_4_ = (uint)(uStack_590 >> 0x20);
    local_308 = -(uint)(0x7f800000 < (uint)local_2a8);
    iStack_304 = -(uint)(0x7f800000 < local_2a8._4_4_);
    iStack_300 = -(uint)(0x7f800000 < (uint)uStack_2a0);
    iStack_2fc = -(uint)(0x7f800000 < uStack_2a0._4_4_);
    local_408 = CONCAT44(iStack_304,local_308);
    uStack_400 = CONCAT44(iStack_2fc,iStack_300);
    local_6a8 = &local_888;
    local_644 = 0x40000000;
    local_148 = &local_668;
    local_84 = 0x40000000;
    local_68 = 0x40000000;
    local_78 = 0x40000000;
    uStack_74 = 0x40000000;
    uStack_70 = 0x40000000;
    uStack_6c = 0x40000000;
    local_668 = 0x4000000040000000;
    uStack_660 = 0x4000000040000000;
    local_128 = 0x4000000040000000;
    uStack_120 = 0x4000000040000000;
    local_138._0_4_ = (float)local_828;
    local_138._4_4_ = (float)((ulong)local_828 >> 0x20);
    uStack_130._0_4_ = (float)uStack_820;
    uStack_130._4_4_ = (float)((ulong)uStack_820 >> 0x20);
    local_118 = (float)local_138 * 2.0;
    fStack_114 = local_138._4_4_ * 2.0;
    fStack_110 = (float)uStack_130 * 2.0;
    fStack_10c = uStack_130._4_4_ * 2.0;
    local_188 = CONCAT44(fStack_114,local_118);
    uStack_180 = CONCAT44(fStack_10c,fStack_110);
    local_720 = &local_878;
    local_198._0_4_ = (float)local_4d8;
    local_198._4_4_ = (float)((ulong)local_4d8 >> 0x20);
    uStack_190._0_4_ = (float)uStack_4d0;
    uStack_190._4_4_ = (float)((ulong)uStack_4d0 >> 0x20);
    local_5d8 = local_118 - (float)local_198;
    fStack_5d4 = fStack_114 - local_198._4_4_;
    fStack_5d0 = fStack_110 - (float)uStack_190;
    fStack_5cc = fStack_10c - uStack_190._4_4_;
    local_418 = CONCAT44(fStack_5d4,local_5d8);
    uStack_410 = CONCAT44(fStack_5cc,fStack_5d0);
    local_710 = &local_858;
    local_488 = local_408 & local_418;
    uStack_480 = uStack_400 & uStack_410;
    local_498 = ~local_408 & local_518;
    uStack_490 = ~uStack_400 & uStack_510;
    local_558 = local_488 | local_498;
    uStack_550 = uStack_480 | uStack_490;
    local_738 = &local_8a8;
    local_2bc = 0x7fffffff;
    local_1fc = 0x7fffffff;
    local_200 = 0x7fffffff;
    local_204 = 0x7fffffff;
    local_208 = 0x7fffffff;
    local_438 = 0x7fffffff7fffffff;
    uStack_430 = 0x7fffffff7fffffff;
    local_578 = local_4b8 & 0x7fffffff7fffffff;
    uStack_570 = uStack_4b0 & 0x7fffffff7fffffff;
    local_560 = &local_708;
    local_2c0 = 0x7f800000;
    local_1dc = 0x7f800000;
    local_1e0 = 0x7f800000;
    local_1e4 = 0x7f800000;
    local_1e8 = 0x7f800000;
    local_298 = 0x7f8000007f800000;
    uStack_290 = 0x7f8000007f800000;
    local_288._0_4_ = (uint)local_578;
    local_288._4_4_ = (uint)(local_578 >> 0x20);
    uStack_280._0_4_ = (uint)uStack_570;
    uStack_280._4_4_ = (uint)(uStack_570 >> 0x20);
    local_2e8 = -(uint)(0x7f800000 < (uint)local_288);
    uStack_2e4 = -(uint)(0x7f800000 < local_288._4_4_);
    uStack_2e0 = -(uint)(0x7f800000 < (uint)uStack_280);
    uStack_2dc = -(uint)(0x7f800000 < uStack_280._4_4_);
    local_3e8 = CONCAT44(uStack_2e4,local_2e8);
    uStack_3e0 = CONCAT44(uStack_2dc,uStack_2e0);
    local_6c0 = &local_8c8;
    local_674 = 0x40000000;
    local_e8 = &local_698;
    local_64 = 0x40000000;
    local_3c = 0x40000000;
    local_58 = 0x40000000;
    uStack_54 = 0x40000000;
    uStack_50 = 0x40000000;
    uStack_4c = 0x40000000;
    local_698 = 0x4000000040000000;
    uStack_690 = 0x4000000040000000;
    local_c8 = 0x4000000040000000;
    uStack_c0 = 0x4000000040000000;
    local_d8._0_4_ = (float)local_838;
    local_d8._4_4_ = (float)((ulong)local_838 >> 0x20);
    uStack_d0._0_4_ = (float)uStack_830;
    uStack_d0._4_4_ = (float)((ulong)uStack_830 >> 0x20);
    local_b8 = (float)local_d8 * 2.0;
    fStack_b4 = local_d8._4_4_ * 2.0;
    fStack_b0 = (float)uStack_d0 * 2.0;
    fStack_ac = uStack_d0._4_4_ * 2.0;
    local_168 = CONCAT44(fStack_b4,local_b8);
    uStack_160 = CONCAT44(fStack_ac,fStack_b0);
    local_740 = &local_8b8;
    local_178._0_4_ = (float)local_4f8;
    local_178._4_4_ = (float)((ulong)local_4f8 >> 0x20);
    uStack_170._0_4_ = (float)uStack_4f0;
    uStack_170._4_4_ = (float)((ulong)uStack_4f0 >> 0x20);
    local_5b8 = local_b8 - (float)local_178;
    fStack_5b4 = fStack_b4 - local_178._4_4_;
    fStack_5b0 = fStack_b0 - (float)uStack_170;
    fStack_5ac = fStack_ac - uStack_170._4_4_;
    local_3f8 = CONCAT44(fStack_5b4,local_5b8);
    uStack_3f0 = CONCAT44(fStack_5ac,fStack_5b0);
    local_730 = &local_898;
    local_468 = local_3e8 & local_3f8;
    uStack_460 = uStack_3e0 & uStack_3f0;
    local_328._0_4_ = (uint)local_4b8;
    local_328._4_4_ = (uint)(local_4b8 >> 0x20);
    uStack_320._0_4_ = (uint)uStack_4b0;
    uStack_320._4_4_ = (uint)(uStack_4b0 >> 0x20);
    local_478 = (local_2e8 ^ 0xffffffff) & (uint)local_328;
    uStack_474 = (uStack_2e4 ^ 0xffffffff) & local_328._4_4_;
    uStack_470 = (uStack_2e0 ^ 0xffffffff) & (uint)uStack_320;
    uStack_46c = (uStack_2dc ^ 0xffffffff) & uStack_320._4_4_;
    local_538 = local_468 | CONCAT44(uStack_474,local_478);
    uStack_530 = uStack_460 | CONCAT44(uStack_46c,uStack_470);
    local_520 = &local_898;
    local_630 = &local_848;
    local_638 = &local_898;
    local_600 = (ulong *)(*(long *)(local_7f8 + 0x18) + local_808 * 0x10);
    local_608 = &local_818;
    *local_600 = local_558;
    local_600[1] = uStack_550;
    local_7e8 = local_808 + 3;
    local_610 = (ulong *)(*(long *)(local_7f8 + 0x18) + local_7e8 * 0x10);
    local_618 = &local_848;
    *local_610 = local_538;
    local_610[1] = uStack_530;
    local_800 = local_800 + 1;
    local_7d8 = local_808;
    local_798 = local_808;
    local_748 = local_780;
    local_728 = local_750;
    local_6f8 = local_780;
    local_6f0 = local_738;
    local_6d8 = local_750;
    local_6d0 = local_718;
    local_6c8 = local_760;
    local_6b8 = local_740;
    local_6b0 = local_770;
    local_6a0 = local_720;
    local_680 = local_770;
    local_670 = local_6c0;
    local_650 = local_760;
    local_640 = local_6a8;
    local_628 = local_710;
    local_620 = local_750;
    local_5f8 = local_758;
    local_5f0 = local_768;
    local_5e8 = local_778;
    local_5e0 = local_788;
    local_5c0 = local_720;
    local_5a0 = local_740;
    local_540 = local_710;
    local_500 = local_750;
    local_4e0 = local_760;
    local_4c0 = local_770;
    local_4a0 = local_780;
    local_448 = local_518;
    uStack_440 = uStack_510;
    local_428 = local_4b8;
    uStack_420 = uStack_4b0;
    local_3d8 = local_718;
    local_3d0 = local_718;
    local_3c8 = local_738;
    local_3c0 = local_738;
    local_3b8 = local_608;
    local_3b0 = local_618;
    local_3a8 = local_770;
    local_3a0 = local_6a8;
    local_398 = local_760;
    local_390 = local_6c0;
    local_388 = local_580;
    local_380 = local_750;
    local_378 = local_560;
    local_370 = local_780;
    local_368 = local_750;
    local_360 = local_720;
    local_358 = local_780;
    local_350 = local_740;
    local_348 = local_518;
    uStack_340 = uStack_510;
    local_338 = local_408;
    uStack_330 = uStack_400;
    local_328 = local_4b8;
    uStack_320 = uStack_4b0;
    local_318 = local_3e8;
    uStack_310 = uStack_3e0;
    local_2f8 = local_458;
    uStack_2f0 = uStack_450;
    local_2d8 = local_438;
    uStack_2d0 = uStack_430;
    local_2a8 = local_598;
    uStack_2a0 = uStack_590;
    local_288 = local_578;
    uStack_280 = uStack_570;
    local_278 = local_598;
    uStack_270 = uStack_590;
    local_268 = local_578;
    uStack_260 = uStack_570;
    local_258 = local_408;
    uStack_250 = uStack_400;
    local_240 = local_718;
    local_238 = local_3e8;
    uStack_230 = uStack_3e0;
    local_220 = local_738;
    local_218 = local_438;
    uStack_210 = uStack_430;
    local_1f8 = local_298;
    uStack_1f0 = uStack_290;
    local_1d8 = local_458;
    uStack_1d0 = uStack_450;
    local_1b8 = local_2b8;
    uStack_1b0 = uStack_2b0;
    local_198 = local_4d8;
    uStack_190 = uStack_4d0;
    local_178 = local_4f8;
    uStack_170 = uStack_4f0;
    local_150 = local_760;
    local_140 = local_6a8;
    local_138 = local_828;
    uStack_130 = uStack_820;
    local_108 = local_6a8;
    local_100 = local_760;
    local_f8 = local_148;
    local_f0 = local_770;
    local_e0 = local_6c0;
    local_d8 = local_838;
    uStack_d0 = uStack_830;
    local_a0 = local_6c0;
    local_98 = local_770;
    local_90 = local_e8;
    local_80 = local_148;
    local_60 = local_e8;
    local_38 = local_558;
    uStack_30 = uStack_550;
    local_20 = local_600;
    local_18 = local_538;
    uStack_10 = uStack_530;
    local_8 = local_610;
    local_8c8 = local_168;
    uStack_8c0 = uStack_160;
    local_8b8 = local_3f8;
    uStack_8b0 = uStack_3f0;
    local_8a8 = local_3e8;
    uStack_8a0 = uStack_3e0;
    local_898 = local_538;
    uStack_890 = uStack_530;
    local_888 = local_188;
    uStack_880 = uStack_180;
    local_878 = local_418;
    uStack_870 = uStack_410;
    local_868 = local_408;
    uStack_860 = uStack_400;
    local_858 = local_558;
    uStack_850 = uStack_550;
    local_848 = local_538;
    uStack_840 = uStack_530;
    local_838 = local_4d8;
    uStack_830 = uStack_4d0;
    local_828 = local_4f8;
    uStack_820 = uStack_4f0;
    local_818 = local_558;
    uStack_810 = uStack_550;
    local_708 = local_578;
    uStack_700 = uStack_570;
    local_6e8 = local_598;
    uStack_6e0 = uStack_590;
  }
  return;
}

Assistant:

void fix_bspline_end_points(const std::vector<unsigned>& indices, avector<Vec3ff>& positions)
  {
    for (size_t i=0; i<indices.size(); i++) 
    {
      const size_t idx = indices[i];
      vfloat4 v0 = vfloat4::loadu(&positions[idx+0]);  
      vfloat4 v1 = vfloat4::loadu(&positions[idx+1]);
      vfloat4 v2 = vfloat4::loadu(&positions[idx+2]);
      vfloat4 v3 = vfloat4::loadu(&positions[idx+3]);
      v0 = select(isnan(v0),2.0f*v1-v2,v0); // nan triggers edge rule
      v3 = select(isnan(v3),2.0f*v2-v1,v3); // nan triggers edge rule
      vfloat4::storeu(&positions[idx+0],v0);
      vfloat4::storeu(&positions[idx+3],v3);
    }
  }